

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

void __thiscall PCCompatible::KeyboardController::run_for(KeyboardController *this,Cycles cycles)

{
  int iVar1;
  KeyboardController *this_local;
  Cycles cycles_local;
  
  if (0 < this->reset_delay_) {
    this_local = (KeyboardController *)cycles.super_WrappedInt<Cycles>.length_;
    iVar1 = WrappedInt<Cycles>::as<int>((WrappedInt<Cycles> *)&this_local);
    this->reset_delay_ = this->reset_delay_ - iVar1;
    if (this->reset_delay_ < 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->input_);
      post(this,0xaa);
    }
  }
  return;
}

Assistant:

void run_for(Cycles cycles) {
			if(reset_delay_ <= 0) {
				return;
			}
			reset_delay_ -= cycles.as<int>();
			if(reset_delay_ <= 0) {
				input_.clear();
				post(0xaa);
			}
		}